

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t lha_read_file_extended_header
                  (archive_read *a,lha *lha,uint16_t *crc,wchar_t sizefield_length,
                  uint64_t limitsize,size_t *total_size)

{
  uint16_t uVar1;
  wchar_t wVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  archive_string_conv *paVar5;
  char *local_98;
  char *charset;
  archive_string cp;
  uint16_t *utf16name;
  short local_68;
  uchar local_65;
  uint uStack_64;
  uint16_t d;
  uint16_t dirSep;
  uchar extdtype;
  uint i;
  size_t datasize;
  size_t extdsize;
  uchar *extdheader;
  void *h;
  size_t *total_size_local;
  uint64_t limitsize_local;
  uint16_t *puStack_28;
  wchar_t sizefield_length_local;
  uint16_t *crc_local;
  lha *lha_local;
  archive_read *a_local;
  
  *total_size = (long)sizefield_length;
  h = total_size;
  total_size_local = (size_t *)limitsize;
  limitsize_local._4_4_ = sizefield_length;
  puStack_28 = crc;
  crc_local = (uint16_t *)lha;
  lha_local = (lha *)a;
  do {
    extdheader = (uchar *)__archive_read_ahead
                                    ((archive_read *)lha_local,(long)limitsize_local._4_4_,
                                     (ssize_t *)0x0);
    if (extdheader == (uchar *)0x0) {
      wVar2 = truncated_error((archive_read *)lha_local);
      return wVar2;
    }
    if (limitsize_local._4_4_ == L'\x02') {
      uVar1 = archive_le16dec(extdheader);
      datasize = (size_t)uVar1;
    }
    else {
      uVar3 = archive_le32dec(extdheader);
      datasize = (size_t)uVar3;
    }
    if (datasize == 0) {
      if (puStack_28 != (uint16_t *)0x0) {
        uVar1 = lha_crc16(*puStack_28,extdheader,(long)limitsize_local._4_4_);
        *puStack_28 = uVar1;
      }
      __archive_read_consume((archive_read *)lha_local,(long)limitsize_local._4_4_);
      return L'\0';
    }
    if ((total_size_local < (size_t *)(*h + datasize)) ||
       (datasize <= (ulong)(long)limitsize_local._4_4_)) goto LAB_00159d8d;
    extdheader = (uchar *)__archive_read_ahead((archive_read *)lha_local,datasize,(ssize_t *)0x0);
    if (extdheader == (uchar *)0x0) {
      wVar2 = truncated_error((archive_read *)lha_local);
      return wVar2;
    }
    *(size_t *)h = datasize + *h;
    local_65 = extdheader[limitsize_local._4_4_];
    _dirSep = datasize - (long)(limitsize_local._4_4_ + L'\x01');
    extdsize = (size_t)(extdheader + (limitsize_local._4_4_ + L'\x01'));
    if ((puStack_28 != (uint16_t *)0x0) && (local_65 != '\0')) {
      uVar1 = lha_crc16(*puStack_28,extdheader,datasize);
      *puStack_28 = uVar1;
    }
    if (local_65 == '\0') {
      if (1 < _dirSep) {
        uVar1 = archive_le16dec((void *)extdsize);
        crc_local[0x5c] = uVar1;
        if (puStack_28 != (uint16_t *)0x0) {
          uVar1 = lha_crc16(*puStack_28,extdheader,datasize - _dirSep);
          *puStack_28 = uVar1;
          uVar1 = lha_crc16(*puStack_28,"",2);
          *puStack_28 = uVar1;
          uVar1 = lha_crc16(*puStack_28,(void *)(extdsize + 2),_dirSep - 2);
          *puStack_28 = uVar1;
        }
      }
    }
    else if (local_65 == '\x01') {
      if (_dirSep == 0) {
        crc_local[0x7c] = 0;
        crc_local[0x7d] = 0;
        crc_local[0x7e] = 0;
        crc_local[0x7f] = 0;
      }
      else {
        if (*(char *)extdsize == '\0') goto LAB_00159d8d;
        crc_local[0x7c] = 0;
        crc_local[0x7d] = 0;
        crc_local[0x7e] = 0;
        crc_local[0x7f] = 0;
        archive_strncat((archive_string *)(crc_local + 0x78),(void *)extdsize,_dirSep);
      }
    }
    else if (local_65 == '\x02') {
      if ((_dirSep == 0) || (*(char *)extdsize == '\0')) {
LAB_00159d8d:
        archive_set_error((archive *)lha_local,0x54,"Invalid extended LHa header");
        return L'\xffffffe2';
      }
      crc_local[0x70] = 0;
      crc_local[0x71] = 0;
      crc_local[0x72] = 0;
      crc_local[0x73] = 0;
      archive_strncat((archive_string *)(crc_local + 0x6c),(void *)extdsize,_dirSep);
      for (uStack_64 = 0; (ulong)uStack_64 < *(ulong *)(crc_local + 0x70); uStack_64 = uStack_64 + 1
          ) {
        if (*(char *)(*(long *)(crc_local + 0x6c) + (ulong)uStack_64) == -1) {
          *(undefined1 *)(*(long *)(crc_local + 0x6c) + (ulong)uStack_64) = 0x2f;
        }
      }
      if (*(char *)(*(long *)(crc_local + 0x6c) + *(long *)(crc_local + 0x70) + -1) != '/')
      goto LAB_00159d8d;
    }
    else if (local_65 == '@') {
      if (_dirSep == 2) {
        uVar1 = archive_le16dec((void *)extdsize);
        *(char *)(crc_local + 0x90) = (char)uVar1;
      }
    }
    else if (local_65 == 'A') {
      if (_dirSep == 0x18) {
        uVar4 = archive_le64dec((void *)extdsize);
        ntfs_to_unix(uVar4,(int64_t *)(crc_local + 0x24),(uint32_t *)(crc_local + 0x28));
        extdsize = extdsize + 8;
        uVar4 = archive_le64dec((void *)extdsize);
        ntfs_to_unix(uVar4,(int64_t *)(crc_local + 0x2c),(uint32_t *)(crc_local + 0x30));
        extdsize = extdsize + 8;
        uVar4 = archive_le64dec((void *)extdsize);
        ntfs_to_unix(uVar4,(int64_t *)(crc_local + 0x34),(uint32_t *)(crc_local + 0x38));
        *(uint *)(crc_local + 0x20) = *(uint *)(crc_local + 0x20) | 3;
      }
    }
    else if (local_65 == 'B') {
      if (_dirSep == 0x10) {
        uVar4 = archive_le64dec((void *)extdsize);
        *(uint64_t *)(crc_local + 0x18) = uVar4;
        extdsize = extdsize + 8;
        uVar4 = archive_le64dec((void *)extdsize);
        *(uint64_t *)(crc_local + 0x1c) = uVar4;
        if ((*(long *)(crc_local + 0x18) < 0) || (*(long *)(crc_local + 0x1c) < 0))
        goto LAB_00159d8d;
      }
    }
    else if (local_65 != 'C') {
      if (local_65 == 'D') {
        if (_dirSep == 0) {
          crc_local[0x7c] = 0;
          crc_local[0x7d] = 0;
          crc_local[0x7e] = 0;
          crc_local[0x7f] = 0;
        }
        else {
          if (((_dirSep & 1) != 0) || (*(char *)extdsize == '\0')) goto LAB_00159d8d;
          crc_local[0x7c] = 0;
          crc_local[0x7d] = 0;
          crc_local[0x7e] = 0;
          crc_local[0x7f] = 0;
          archive_array_append((archive_string *)(crc_local + 0x78),(char *)extdsize,_dirSep);
          paVar5 = archive_string_conversion_from_charset
                             ((archive_conflict *)lha_local,"UTF-16LE",L'\x01');
          *(archive_string_conv **)(crc_local + 100) = paVar5;
          if (*(long *)(crc_local + 100) == 0) {
            return L'\xffffffe2';
          }
        }
      }
      else if (local_65 == 'E') {
        if (((_dirSep == 0) || ((_dirSep & 1) != 0)) || (*(char *)extdsize == '\0'))
        goto LAB_00159d8d;
        crc_local[0x70] = 0;
        crc_local[0x71] = 0;
        crc_local[0x72] = 0;
        crc_local[0x73] = 0;
        archive_array_append((archive_string *)(crc_local + 0x6c),(char *)extdsize,_dirSep);
        paVar5 = archive_string_conversion_from_charset
                           ((archive_conflict *)lha_local,"UTF-16LE",L'\x01');
        *(archive_string_conv **)(crc_local + 0x60) = paVar5;
        if (*(long *)(crc_local + 0x60) == 0) {
          return L'\xffffffe2';
        }
        utf16name._6_2_ = 1;
        uVar1 = archive_be16dec((void *)((long)&utf16name + 6));
        if (uVar1 == 1) {
          local_68 = 0x2f00;
        }
        else {
          local_68 = 0x2f;
        }
        cp.buffer_length = *(size_t *)(crc_local + 0x6c);
        for (uStack_64 = 0; (ulong)uStack_64 < *(ulong *)(crc_local + 0x70) >> 1;
            uStack_64 = uStack_64 + 1) {
          if (*(short *)(cp.buffer_length + (ulong)uStack_64 * 2) == -1) {
            *(short *)(cp.buffer_length + (ulong)uStack_64 * 2) = local_68;
          }
        }
        if (*(short *)(cp.buffer_length + ((*(ulong *)(crc_local + 0x70) >> 1) - 1) * 2) != local_68
           ) goto LAB_00159d8d;
      }
      else if (local_65 == 'F') {
        if (_dirSep == 4) {
          charset = (char *)0x0;
          cp.s = (char *)0x0;
          cp.length = 0;
          uVar3 = archive_le32dec((void *)extdsize);
          if (uVar3 == 0xfde9) {
            local_98 = "UTF-8";
          }
          else {
            uVar3 = archive_le32dec((void *)extdsize);
            archive_string_sprintf((archive_string *)&charset,"CP%d",(ulong)uVar3);
            local_98 = charset;
          }
          paVar5 = archive_string_conversion_from_charset
                             ((archive_conflict *)lha_local,local_98,L'\x01');
          *(archive_string_conv **)(crc_local + 0x60) = paVar5;
          paVar5 = archive_string_conversion_from_charset
                             ((archive_conflict *)lha_local,local_98,L'\x01');
          *(archive_string_conv **)(crc_local + 100) = paVar5;
          archive_string_free((archive_string *)&charset);
          if (*(long *)(crc_local + 0x60) == 0) {
            return L'\xffffffe2';
          }
          if (*(long *)(crc_local + 100) == 0) {
            return L'\xffffffe2';
          }
        }
      }
      else if (local_65 == 'P') {
        if (_dirSep == 2) {
          uVar1 = archive_le16dec((void *)extdsize);
          *(uint *)(crc_local + 0x3a) = (uint)uVar1;
          *(uint *)(crc_local + 0x20) = *(uint *)(crc_local + 0x20) | 4;
        }
      }
      else if (local_65 == 'Q') {
        if (_dirSep == 4) {
          uVar1 = archive_le16dec((void *)extdsize);
          *(ulong *)(crc_local + 0x40) = (ulong)uVar1;
          uVar1 = archive_le16dec((void *)(extdsize + 2));
          *(ulong *)(crc_local + 0x3c) = (ulong)uVar1;
        }
      }
      else if (local_65 == 'R') {
        if (_dirSep != 0) {
          crc_local[0x54] = 0;
          crc_local[0x55] = 0;
          crc_local[0x56] = 0;
          crc_local[0x57] = 0;
          archive_strncat((archive_string *)(crc_local + 0x50),(void *)extdsize,_dirSep);
        }
      }
      else if (local_65 == 'S') {
        if (_dirSep != 0) {
          crc_local[0x48] = 0;
          crc_local[0x49] = 0;
          crc_local[0x4a] = 0;
          crc_local[0x4b] = 0;
          archive_strncat((archive_string *)(crc_local + 0x44),(void *)extdsize,_dirSep);
        }
      }
      else if (local_65 == 'T') {
        if (_dirSep == 4) {
          uVar3 = archive_le32dec((void *)extdsize);
          *(ulong *)(crc_local + 0x2c) = (ulong)uVar3;
        }
      }
      else if (local_65 == '\x7f') {
        if (_dirSep == 0x10) {
          uVar1 = archive_le16dec((void *)extdsize);
          *(char *)(crc_local + 0x90) = (char)uVar1;
          uVar1 = archive_le16dec((void *)(extdsize + 2));
          *(uint *)(crc_local + 0x3a) = (uint)uVar1;
          uVar1 = archive_le16dec((void *)(extdsize + 4));
          *(ulong *)(crc_local + 0x40) = (ulong)uVar1;
          uVar1 = archive_le16dec((void *)(extdsize + 6));
          *(ulong *)(crc_local + 0x3c) = (ulong)uVar1;
          uVar3 = archive_le32dec((void *)(extdsize + 8));
          *(ulong *)(crc_local + 0x24) = (ulong)uVar3;
          uVar3 = archive_le32dec((void *)(extdsize + 0xc));
          *(ulong *)(crc_local + 0x34) = (ulong)uVar3;
          *(uint *)(crc_local + 0x20) = *(uint *)(crc_local + 0x20) | 7;
        }
      }
      else if ((local_65 == 0xff) && (_dirSep == 0x14)) {
        uVar3 = archive_le32dec((void *)extdsize);
        *(uint32_t *)(crc_local + 0x3a) = uVar3;
        uVar3 = archive_le32dec((void *)(extdsize + 4));
        *(ulong *)(crc_local + 0x40) = (ulong)uVar3;
        uVar3 = archive_le32dec((void *)(extdsize + 8));
        *(ulong *)(crc_local + 0x3c) = (ulong)uVar3;
        uVar3 = archive_le32dec((void *)(extdsize + 0xc));
        *(ulong *)(crc_local + 0x24) = (ulong)uVar3;
        uVar3 = archive_le32dec((void *)(extdsize + 0x10));
        *(ulong *)(crc_local + 0x34) = (ulong)uVar3;
        *(uint *)(crc_local + 0x20) = *(uint *)(crc_local + 0x20) | 7;
      }
    }
    __archive_read_consume((archive_read *)lha_local,datasize);
  } while( true );
}

Assistant:

static int
lha_read_file_extended_header(struct archive_read *a, struct lha *lha,
    uint16_t *crc, int sizefield_length, uint64_t limitsize, size_t *total_size)
{
	const void *h;
	const unsigned char *extdheader;
	size_t	extdsize;
	size_t	datasize;
	unsigned int i;
	unsigned char extdtype;

#define EXT_HEADER_CRC		0x00		/* Header CRC and information*/
#define EXT_FILENAME		0x01		/* Filename 		    */
#define EXT_DIRECTORY		0x02		/* Directory name	    */
#define EXT_DOS_ATTR		0x40		/* MS-DOS attribute	    */
#define EXT_TIMESTAMP		0x41		/* Windows time stamp	    */
#define EXT_FILESIZE		0x42		/* Large file size	    */
#define EXT_TIMEZONE		0x43		/* Time zone		    */
#define EXT_UTF16_FILENAME	0x44		/* UTF-16 filename 	    */
#define EXT_UTF16_DIRECTORY	0x45		/* UTF-16 directory name    */
#define EXT_CODEPAGE		0x46		/* Codepage		    */
#define EXT_UNIX_MODE		0x50		/* File permission	    */
#define EXT_UNIX_GID_UID	0x51		/* gid,uid		    */
#define EXT_UNIX_GNAME		0x52		/* Group name		    */
#define EXT_UNIX_UNAME		0x53		/* User name		    */
#define EXT_UNIX_MTIME		0x54		/* Modified time	    */
#define EXT_OS2_NEW_ATTR	0x7f		/* new attribute(OS/2 only) */
#define EXT_NEW_ATTR		0xff		/* new attribute	    */

	*total_size = sizefield_length;

	for (;;) {
		/* Read an extended header size. */
		if ((h =
		    __archive_read_ahead(a, sizefield_length, NULL)) == NULL)
			return (truncated_error(a));
		/* Check if the size is the zero indicates the end of the
		 * extended header. */
		if (sizefield_length == sizeof(uint16_t))
			extdsize = archive_le16dec(h);
		else
			extdsize = archive_le32dec(h);
		if (extdsize == 0) {
			/* End of extended header */
			if (crc != NULL)
				*crc = lha_crc16(*crc, h, sizefield_length);
			__archive_read_consume(a, sizefield_length);
			return (ARCHIVE_OK);
		}

		/* Sanity check to the extended header size. */
		if (((uint64_t)*total_size + extdsize) > limitsize ||
		    extdsize <= (size_t)sizefield_length)
			goto invalid;

		/* Read the extended header. */
		if ((h = __archive_read_ahead(a, extdsize, NULL)) == NULL)
			return (truncated_error(a));
		*total_size += extdsize;

		extdheader = (const unsigned char *)h;
		/* Get the extended header type. */
		extdtype = extdheader[sizefield_length];
		/* Calculate an extended data size. */
		datasize = extdsize - (1 + sizefield_length);
		/* Skip an extended header size field and type field. */
		extdheader += sizefield_length + 1;

		if (crc != NULL && extdtype != EXT_HEADER_CRC)
			*crc = lha_crc16(*crc, h, extdsize);
		switch (extdtype) {
		case EXT_HEADER_CRC:
			/* We only use a header CRC. Following data will not
			 * be used. */
			if (datasize >= 2) {
				lha->header_crc = archive_le16dec(extdheader);
				if (crc != NULL) {
					static const char zeros[2] = {0, 0};
					*crc = lha_crc16(*crc, h,
					    extdsize - datasize);
					/* CRC value itself as zero */
					*crc = lha_crc16(*crc, zeros, 2);
					*crc = lha_crc16(*crc,
					    extdheader+2, datasize - 2);
				}
			}
			break;
		case EXT_FILENAME:
			if (datasize == 0) {
				/* maybe directory header */
				archive_string_empty(&lha->filename);
				break;
			}
			if (extdheader[0] == '\0')
				goto invalid;
			archive_strncpy(&lha->filename,
			    (const char *)extdheader, datasize);
			break;
		case EXT_UTF16_FILENAME:
			if (datasize == 0) {
				/* maybe directory header */
				archive_string_empty(&lha->filename);
				break;
			} else if (datasize & 1) {
				/* UTF-16 characters take always 2 or 4 bytes */
				goto invalid;
			}
			if (extdheader[0] == '\0')
				goto invalid;
			archive_string_empty(&lha->filename);
			archive_array_append(&lha->filename,
				(const char *)extdheader, datasize);
			/* Setup a string conversion for a filename. */
			lha->sconv_fname =
			    archive_string_conversion_from_charset(&a->archive,
			        "UTF-16LE", 1);
			if (lha->sconv_fname == NULL)
				return (ARCHIVE_FATAL);
			break;
		case EXT_DIRECTORY:
			if (datasize == 0 || extdheader[0] == '\0')
				/* no directory name data. exit this case. */
				goto invalid;

			archive_strncpy(&lha->dirname,
		  	    (const char *)extdheader, datasize);
			/*
			 * Convert directory delimiter from 0xFF
			 * to '/' for local system.
	 		 */
			for (i = 0; i < lha->dirname.length; i++) {
				if ((unsigned char)lha->dirname.s[i] == 0xFF)
					lha->dirname.s[i] = '/';
			}
			/* Is last character directory separator? */
			if (lha->dirname.s[lha->dirname.length-1] != '/')
				/* invalid directory data */
				goto invalid;
			break;
		case EXT_UTF16_DIRECTORY:
			/* UTF-16 characters take always 2 or 4 bytes */
			if (datasize == 0 || (datasize & 1) ||
			    extdheader[0] == '\0') {
				/* no directory name data. exit this case. */
				goto invalid;
			}

			archive_string_empty(&lha->dirname);
			archive_array_append(&lha->dirname,
				(const char *)extdheader, datasize);
			lha->sconv_dir =
			    archive_string_conversion_from_charset(&a->archive,
			        "UTF-16LE", 1);
			if (lha->sconv_dir == NULL)
				return (ARCHIVE_FATAL);
			else {
				/*
				 * Convert directory delimiter from 0xFFFF
				 * to '/' for local system.
				 */
				uint16_t dirSep;
				uint16_t d = 1;
				if (archive_be16dec(&d) == 1)
					dirSep = 0x2F00;
				else
					dirSep = 0x002F;

				/* UTF-16LE character */
				uint16_t *utf16name =
				    (uint16_t *)lha->dirname.s;
				for (i = 0; i < lha->dirname.length / 2; i++) {
					if (utf16name[i] == 0xFFFF) {
						utf16name[i] = dirSep;
					}
				}
				/* Is last character directory separator? */
				if (utf16name[lha->dirname.length / 2 - 1] !=
				    dirSep) {
					/* invalid directory data */
					goto invalid;
				}
			}
			break;
		case EXT_DOS_ATTR:
			if (datasize == 2)
				lha->dos_attr = (unsigned char)
				    (archive_le16dec(extdheader) & 0xff);
			break;
		case EXT_TIMESTAMP:
			if (datasize == (sizeof(uint64_t) * 3)) {
				ntfs_to_unix(archive_le64dec(extdheader),
					&lha->birthtime,
				    &lha->birthtime_tv_nsec);
				extdheader += sizeof(uint64_t);
				ntfs_to_unix(archive_le64dec(extdheader),
					&lha->mtime,
				    &lha->mtime_tv_nsec);
				extdheader += sizeof(uint64_t);
				ntfs_to_unix(archive_le64dec(extdheader),
					&lha->atime,
				    &lha->atime_tv_nsec);
				lha->setflag |= BIRTHTIME_IS_SET |
				    ATIME_IS_SET;
			}
			break;
		case EXT_FILESIZE:
			if (datasize == sizeof(uint64_t) * 2) {
				lha->compsize = archive_le64dec(extdheader);
				extdheader += sizeof(uint64_t);
				lha->origsize = archive_le64dec(extdheader);
				if (lha->compsize < 0 || lha->origsize < 0)
					goto invalid;
			}
			break;
		case EXT_CODEPAGE:
			/* Get an archived filename charset from codepage.
			 * This overwrites the charset specified by
			 * hdrcharset option. */
			if (datasize == sizeof(uint32_t)) {
				struct archive_string cp;
				const char *charset;

				archive_string_init(&cp);
				switch (archive_le32dec(extdheader)) {
				case 65001: /* UTF-8 */
					charset = "UTF-8";
					break;
				default:
					archive_string_sprintf(&cp, "CP%d",
					    (int)archive_le32dec(extdheader));
					charset = cp.s;
					break;
				}
				lha->sconv_dir =
				    archive_string_conversion_from_charset(
					&(a->archive), charset, 1);
				lha->sconv_fname =
				    archive_string_conversion_from_charset(
					&(a->archive), charset, 1);
				archive_string_free(&cp);
				if (lha->sconv_dir == NULL)
					return (ARCHIVE_FATAL);
				if (lha->sconv_fname == NULL)
					return (ARCHIVE_FATAL);
			}
			break;
		case EXT_UNIX_MODE:
			if (datasize == sizeof(uint16_t)) {
				lha->mode = archive_le16dec(extdheader);
				lha->setflag |= UNIX_MODE_IS_SET;
			}
			break;
		case EXT_UNIX_GID_UID:
			if (datasize == (sizeof(uint16_t) * 2)) {
				lha->gid = archive_le16dec(extdheader);
				lha->uid = archive_le16dec(extdheader+2);
			}
			break;
		case EXT_UNIX_GNAME:
			if (datasize > 0)
				archive_strncpy(&lha->gname,
				    (const char *)extdheader, datasize);
			break;
		case EXT_UNIX_UNAME:
			if (datasize > 0)
				archive_strncpy(&lha->uname,
				    (const char *)extdheader, datasize);
			break;
		case EXT_UNIX_MTIME:
			if (datasize == sizeof(uint32_t))
				lha->mtime = archive_le32dec(extdheader);
			break;
		case EXT_OS2_NEW_ATTR:
			/* This extended header is OS/2 depend. */
			if (datasize == 16) {
				lha->dos_attr = (unsigned char)
				    (archive_le16dec(extdheader) & 0xff);
				lha->mode = archive_le16dec(extdheader+2);
				lha->gid = archive_le16dec(extdheader+4);
				lha->uid = archive_le16dec(extdheader+6);
				lha->birthtime = archive_le32dec(extdheader+8);
				lha->atime = archive_le32dec(extdheader+12);
				lha->setflag |= UNIX_MODE_IS_SET
				    | BIRTHTIME_IS_SET | ATIME_IS_SET;
			}
			break;
		case EXT_NEW_ATTR:
			if (datasize == 20) {
				lha->mode = (mode_t)archive_le32dec(extdheader);
				lha->gid = archive_le32dec(extdheader+4);
				lha->uid = archive_le32dec(extdheader+8);
				lha->birthtime = archive_le32dec(extdheader+12);
				lha->atime = archive_le32dec(extdheader+16);
				lha->setflag |= UNIX_MODE_IS_SET
				    | BIRTHTIME_IS_SET | ATIME_IS_SET;
			}
			break;
		case EXT_TIMEZONE:		/* Not supported */
			break;
		default:
			break;
		}

		__archive_read_consume(a, extdsize);
	}
invalid:
	archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
	    "Invalid extended LHa header");
	return (ARCHIVE_FATAL);
}